

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# machine_implementation.cc
# Opt level: O0

bool testbench::machine::availability::is(char *name)

{
  vector<const_char_*,_std::allocator<const_char_*>_> *this;
  bool bVar1;
  int iVar2;
  reference ppcVar3;
  char *current_name;
  iterator __end1;
  iterator __begin1;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1;
  char *name_local;
  
  anon_unknown_0::factory_init();
  this = (anonymous_namespace)::machines;
  __end1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                     ((anonymous_namespace)::machines);
  current_name = (char *)std::vector<const_char_*,_std::allocator<const_char_*>_>::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                *)&current_name);
    if (!bVar1) {
      return false;
    }
    ppcVar3 = __gnu_cxx::
              __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              ::operator*(&__end1);
    iVar2 = strcmp(*ppcVar3,name);
    if (iVar2 == 0) break;
    __gnu_cxx::
    __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
    operator++(&__end1);
  }
  return true;
}

Assistant:

bool machine::availability::is(const char *name)
{
    factory_init();
    for (auto current_name : machines->names) {
        if (strcmp(current_name, name) == 0) {
            return true;
        }
    }
    return false;
}